

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

namespace_t __thiscall cs::instance_type::import(instance_type *this,string *path,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  size_type sVar3;
  pointer pcVar4;
  slot_type *psVar5;
  compiler_type *this_00;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  instance_type *this_01;
  size_t __n;
  pointer pbVar8;
  int iVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long *plVar10;
  size_t sVar11;
  fatal_error *this_02;
  runtime_error *prVar12;
  ulong *in_RCX;
  size_type *psVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer pbVar14;
  size_type sVar15;
  instance_type *args_1;
  namespace_t nVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string package_path;
  context_t rt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  collection;
  string tmp;
  string local_2c8;
  key_arg<std::__cxx11::basic_string<char>_> local_2a8;
  string *local_288;
  long *local_280;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_278;
  instance_type *local_270;
  string *local_268;
  ulong *local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  undefined1 local_238 [16];
  name_space local_228 [21];
  
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238._0_8_ = local_228;
  local_238._8_8_ = (slot_type *)0x0;
  local_228[0]._vptr_name_space._0_1_ = '\0';
  sVar3 = name->_M_string_length;
  local_270 = this;
  local_268 = path;
  local_260 = in_RCX;
  if (sVar3 != 0) {
    pcVar4 = (name->_M_dataplus)._M_p;
    sVar15 = 0;
    do {
      if (pcVar4[sVar15] == ':') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_258,(value_type *)local_238);
        local_238._8_8_ = (slot_type *)0x0;
        *(char *)local_238._0_8_ = '\0';
      }
      else {
        std::__cxx11::string::push_back((char)(value_type *)local_238);
      }
      sVar15 = sVar15 + 1;
    } while (sVar3 != sVar15);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_258,(value_type *)local_238);
  if ((name_space *)local_238._0_8_ != local_228) {
    operator_delete((void *)local_238._0_8_,
                    CONCAT71(local_228[0]._vptr_name_space._1_7_,local_228[0]._vptr_name_space._0_1_
                            ) + 1);
  }
  pbVar8 = local_258.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_288 = local_268 + 9;
    paVar1 = &local_2c8.field_2;
    pbVar14 = local_258.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_238._0_8_ = local_228;
      pcVar4 = (pbVar14->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,pcVar4,pcVar4 + pbVar14->_M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)local_238,local_238._8_8_,0,'\x01');
      plVar10 = (long *)std::__cxx11::string::_M_append((char *)local_238,*local_260);
      psVar13 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_2a8.field_2._M_allocated_capacity = *psVar13;
        local_2a8.field_2._8_8_ = plVar10[3];
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *psVar13;
        local_2a8._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_2a8._M_string_length = plVar10[1];
      *plVar10 = (long)psVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((name_space *)local_238._0_8_ != local_228) {
        operator_delete((void *)local_238._0_8_,
                        CONCAT71(local_228[0]._vptr_name_space._1_7_,
                                 local_228[0]._vptr_name_space._0_1_) + 1);
      }
      sVar11 = phmap::priv::
               raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
               ::count<std::__cxx11::string>
                         ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
                           *)(*(long *)(local_288->_M_dataplus)._M_p + 0x48),&local_2a8);
      if (sVar11 != 0) {
        phmap::priv::
        raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
        ::try_emplace_impl<std::__cxx11::string_const&>
                  ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>::iterator,_bool>
                    *)local_238,(void *)(*(long *)(local_288->_M_dataplus)._M_p + 0x48),&local_2a8);
        (local_270->super_runtime_type).literals.
        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .
        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .ctrl_ = (ctrl_t *)
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_238._8_8_ + 0x20))->
                 _vptr__Sp_counted_base;
        psVar5 = *(slot_type **)(local_238._8_8_ + 0x28);
        (local_270->super_runtime_type).literals.
        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .
        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .slots_ = psVar5;
        args_1 = local_270;
        if (psVar5 != (slot_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar13 = &(psVar5->value).first._M_string_length;
            *(int *)psVar13 = (int)*psVar13 + 1;
            UNLOCK();
          }
          else {
            psVar13 = &(psVar5->value).first._M_string_length;
            *(int *)psVar13 = (int)*psVar13 + 1;
          }
        }
LAB_0015349a:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_258);
        nVar16.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             extraout_RDX._M_pi;
        nVar16.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)args_1;
        return (namespace_t)nVar16.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>;
      }
      local_2c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c8,local_2a8._M_dataplus._M_p,
                 local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
      std::__cxx11::string::append((char *)&local_2c8);
      std::ifstream::ifstream((string *)local_238,(string *)&local_2c8,_S_in);
      uVar2 = *(uint *)(&local_228[0].is_ref +
                       (long)((name_space *)(local_238._0_8_ + -0x18))->_vptr_name_space);
      std::ifstream::~ifstream((string *)local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((uVar2 & 5) == 0) {
        create_subcontext((cs *)&local_280,(context_t *)local_288);
        this_00 = (compiler_type *)*local_280;
        local_238._0_8_ = local_228;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,local_2a8._M_dataplus._M_p,
                   local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
        std::__cxx11::string::append(local_238);
        local_2c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c8,local_2a8._M_dataplus._M_p,
                   local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
        std::__cxx11::string::append((char *)&local_2c8);
        compiler_type::import_csym(this_00,(string *)local_238,&local_2c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        args_1 = local_270;
        if ((name_space *)local_238._0_8_ != local_228) {
          operator_delete((void *)local_238._0_8_,
                          CONCAT71(local_228[0]._vptr_name_space._1_7_,
                                   local_228[0]._vptr_name_space._0_1_) + 1);
        }
        lVar6 = *local_280;
        if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_278->_M_use_count = local_278->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_278->_M_use_count = local_278->_M_use_count + 1;
          }
        }
        *(long **)(lVar6 + 0x20) = local_280;
        p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x28);
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x28) = local_278;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        this_01 = (instance_type *)local_280[2];
        local_238._0_8_ = local_228;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,local_2a8._M_dataplus._M_p,
                   local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
        std::__cxx11::string::append(local_238);
        compile(this_01,(string *)local_238);
        if ((name_space *)local_238._0_8_ != local_228) {
          operator_delete((void *)local_238._0_8_,
                          CONCAT71(local_228[0]._vptr_name_space._1_7_,
                                   local_228[0]._vptr_name_space._0_1_) + 1);
        }
        plVar10 = (long *)local_268[9]._M_dataplus._M_p;
        sVar3 = local_268[9]._M_string_length;
        lVar6 = *plVar10;
        if (sVar3 != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(sVar3 + 8) = *(int *)(sVar3 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(sVar3 + 8) = *(int *)(sVar3 + 8) + 1;
          }
        }
        *(long **)(lVar6 + 0x20) = plVar10;
        p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x28);
        *(size_type *)(lVar6 + 0x28) = sVar3;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        interpret((instance_type *)local_280[2]);
        __n = local_280[0x13];
        if (__n == 0) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x28);
          local_238._0_8_ = local_228;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"Target file is not a package.","");
          runtime_error::runtime_error(prVar12,(string *)local_238);
          __cxa_throw(prVar12,&runtime_error::typeinfo,runtime_error::~runtime_error);
        }
        if (__n == local_260[1]) {
          iVar9 = bcmp((void *)local_280[0x12],(void *)*local_260,__n);
          if (iVar9 == 0) {
            domain_manager::get_namespace((domain_manager *)local_238);
            (args_1->super_runtime_type).literals.
            super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
            .
            super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
            .ctrl_ = (ctrl_t *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<cs::name_space,std::allocator<cs::name_space>,cs::name_space&>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &(args_1->super_runtime_type).literals.
                        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
                        .
                        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
                        .slots_,(name_space **)args_1,(allocator<cs::name_space> *)&local_2c8,
                       (name_space *)local_238._0_8_);
            if ((slot_type *)local_238._8_8_ != (slot_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
            }
            phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
            ::
            emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<cs::name_space>_&,_0>
                      ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>::iterator,_bool>
                        *)local_238,
                       (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                        *)(*(long *)(local_288->_M_dataplus)._M_p + 0x48),&local_2a8,
                       (shared_ptr<cs::name_space> *)args_1);
            if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
            }
            goto LAB_0015349a;
          }
        }
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_238._0_8_ = local_228;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"Package name is different from file name.","");
        runtime_error::runtime_error(prVar12,(string *)local_238);
        __cxa_throw(prVar12,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      local_2c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c8,local_2a8._M_dataplus._M_p,
                 local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
      std::__cxx11::string::append((char *)&local_2c8);
      std::ifstream::ifstream((string *)local_238,(string *)&local_2c8,_S_in);
      uVar2 = *(uint *)(&local_228[0].is_ref +
                       (long)((name_space *)(local_238._0_8_ + -0x18))->_vptr_name_space);
      std::ifstream::~ifstream((string *)local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((uVar2 & 5) == 0) {
        local_238._0_8_ = local_228;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,local_2a8._M_dataplus._M_p,
                   local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
        std::__cxx11::string::append(local_238);
        args_1 = local_270;
        local_2c8._M_dataplus._M_p = (ctrl_t *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<cs::extension,std::allocator<cs::extension>,std::__cxx11::string>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2c8._M_string_length,
                   (extension **)&local_2c8,(allocator<cs::extension> *)&local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
        sVar3 = local_2c8._M_string_length;
        local_2c8._M_string_length = 0;
        (args_1->super_runtime_type).literals.
        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .
        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .ctrl_ = local_2c8._M_dataplus._M_p;
        (args_1->super_runtime_type).literals.
        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .
        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .slots_ = (slot_type *)sVar3;
        local_2c8._M_dataplus._M_p = (pointer)0x0;
        if ((name_space *)local_238._0_8_ != local_228) {
          operator_delete((void *)local_238._0_8_,
                          CONCAT71(local_228[0]._vptr_name_space._1_7_,
                                   local_228[0]._vptr_name_space._0_1_) + 1);
        }
        phmap::priv::
        raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
        ::
        emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::shared_ptr<cs::name_space>_&,_0>
                  ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>::iterator,_bool>
                    *)local_238,
                   (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                    *)(*(long *)(local_288->_M_dataplus)._M_p + 0x48),&local_2a8,
                   (shared_ptr<cs::name_space> *)args_1);
        goto LAB_0015349a;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 != pbVar8);
  }
  this_02 = (fatal_error *)__cxa_allocate_exception(0x28);
  local_238._0_8_ = local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,"No such file or directory.","");
  fatal_error::fatal_error(this_02,(string *)local_238);
  __cxa_throw(this_02,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

namespace_t instance_type::import(const std::string &path, const std::string &name)
	{
		std::vector<std::string> collection;
		{
			std::string tmp;
			for (auto &ch: path) {
				if (ch == cs::path_delimiter) {
					collection.push_back(tmp);
					tmp.clear();
				}
				else
					tmp.push_back(ch);
			}
			collection.push_back(tmp);
		}
		for (auto &it: collection) {
			std::string package_path = it + path_separator + name;
			if (context->compiler->modules.count(package_path) > 0)
				return context->compiler->modules[package_path];
			if (std::ifstream(package_path + ".csp")) {
				context_t rt = create_subcontext(context);
				rt->compiler->import_csym(package_path + ".csp", package_path + ".csym");
				rt->compiler->swap_context(rt);
				try {
					rt->instance->compile(package_path + ".csp");
				}
				catch (...) {
					context->compiler->swap_context(context);
					throw;
				}
				context->compiler->swap_context(context);
				rt->instance->interpret();
				if (rt->package_name.empty())
					throw runtime_error("Target file is not a package.");
				if (rt->package_name != name)
					throw runtime_error("Package name is different from file name.");
				namespace_t module = std::make_shared<name_space>(*rt->instance->storage.get_namespace());
				context->compiler->modules.emplace(package_path, module);
				return module;
			}
			else if (std::ifstream(package_path + ".cse")) {
				namespace_t module = std::make_shared<extension>(package_path + ".cse");
				context->compiler->modules.emplace(package_path, module);
				return module;
			}
		}
		throw fatal_error("No such file or directory.");
	}